

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrderParameterProbZ.cpp
# Opt level: O0

void __thiscall
OpenMD::OrderParameterProbZ::OrderParameterProbZ
          (OrderParameterProbZ *this,SimInfo *info,string *filename,string *sele,RealType dipoleX,
          RealType dipoleY,RealType dipoleZ,int nbins,int axis)

{
  undefined1 uVar1;
  string *in_RCX;
  SimInfo *in_RSI;
  SelectionEvaluator *in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  SimInfo *in_stack_00000128;
  SelectionManager *in_stack_00000130;
  undefined4 in_stack_fffffffffffffe78;
  uint in_stack_fffffffffffffe7c;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  int iVar2;
  SimInfo *in_stack_fffffffffffffe88;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __last;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffe90;
  undefined7 in_stack_fffffffffffffe98;
  pointer *this_00;
  SelectionEvaluator *this_01;
  string *script;
  string local_120 [32];
  string local_100 [120];
  SimInfo *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  
  StaticAnalyser::StaticAnalyser
            ((StaticAnalyser *)in_stack_fffffffffffffe90._M_current,in_stack_fffffffffffffe88,
             (string *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
             in_stack_fffffffffffffe7c);
  *(undefined ***)&(in_RDI->compiler).filename = &PTR__OrderParameterProbZ_005609b8;
  std::__cxx11::string::string((string *)&(in_RDI->compiler).ichToken,in_RCX);
  script = (string *)&(in_RDI->compiler).ichCurrentCommand;
  SelectionEvaluator::SelectionEvaluator
            ((SelectionEvaluator *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
             in_stack_ffffffffffffff78);
  SelectionManager::SelectionManager(in_stack_00000130,in_stack_00000128);
  Thermo::Thermo((Thermo *)&in_RDI[1].pc,in_RSI);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x20bfd6);
  this_01 = (SelectionEvaluator *)((long)&in_RDI[1].errorMessage.field_2 + 8);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x20bfec);
  Vector3<double>::Vector3((Vector3<double> *)0x20bffd);
  Vector3<double>::Vector3((Vector3<double> *)0x20c010);
  this_00 = &in_RDI[1].nameFinder.nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x20c028);
  *(undefined4 *)&in_RDI[1].distanceFinder.info_ = in_R8D;
  *(undefined4 *)((long)&in_RDI[1].distanceFinder.info_ + 4) = in_R9D;
  std::__cxx11::string::string((string *)&in_RDI[1].distanceFinder.stuntdoubles_);
  SelectionEvaluator::loadScriptString(in_RDI,script);
  uVar1 = SelectionEvaluator::isDynamic((SelectionEvaluator *)&(in_RDI->compiler).ichCurrentCommand)
  ;
  if (!(bool)uVar1) {
    in_stack_fffffffffffffe90._M_current = (double *)&in_RDI[1].compiler.ichCurrentCommand;
    SelectionEvaluator::evaluate(this_01);
    SelectionManager::setSelectionSet
              ((SelectionManager *)in_stack_fffffffffffffe90._M_current,
               (SelectionSet *)in_stack_fffffffffffffe88);
    SelectionSet::~SelectionSet((SelectionSet *)0x20c0e2);
  }
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)this_00,
             CONCAT17(uVar1,in_stack_fffffffffffffe98));
  __last._M_current =
       (double *)
       &in_RDI[1].nameFinder.nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage;
  std::vector<double,_std::allocator<double>_>::begin
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  std::vector<double,_std::allocator<double>_>::end
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  std::fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,int>
            (in_stack_fffffffffffffe90,__last,
             (int *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
  iVar2 = *(int *)((long)&in_RDI[1].distanceFinder.info_ + 4);
  if (iVar2 == 0) {
    std::__cxx11::string::operator=((string *)&in_RDI[1].distanceFinder.stuntdoubles_,"x");
    Vector3<double>::Vector3
              ((Vector3<double> *)in_stack_fffffffffffffe90._M_current,(double)__last._M_current,
               (double)CONCAT44(iVar2,in_stack_fffffffffffffe80),
               (double)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    Vector3<double>::operator=
              ((Vector3<double> *)CONCAT44(iVar2,in_stack_fffffffffffffe80),
               (Vector3<double> *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  }
  else if (iVar2 == 1) {
    std::__cxx11::string::operator=((string *)&in_RDI[1].distanceFinder.stuntdoubles_,"y");
    Vector3<double>::Vector3
              ((Vector3<double> *)in_stack_fffffffffffffe90._M_current,(double)__last._M_current,
               (double)CONCAT44(iVar2,in_stack_fffffffffffffe80),
               (double)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    Vector3<double>::operator=
              ((Vector3<double> *)CONCAT44(iVar2,in_stack_fffffffffffffe80),
               (Vector3<double> *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  }
  else {
    std::__cxx11::string::operator=((string *)&in_RDI[1].distanceFinder.stuntdoubles_,"z");
    Vector3<double>::Vector3
              ((Vector3<double> *)in_stack_fffffffffffffe90._M_current,(double)__last._M_current,
               (double)CONCAT44(iVar2,in_stack_fffffffffffffe80),
               (double)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    Vector3<double>::operator=
              ((Vector3<double> *)CONCAT44(iVar2,in_stack_fffffffffffffe80),
               (Vector3<double> *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  }
  Vector3<double>::Vector3
            ((Vector3<double> *)in_stack_fffffffffffffe90._M_current,(double)__last._M_current,
             (double)CONCAT44(iVar2,in_stack_fffffffffffffe80),
             (double)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  Vector3<double>::operator=
            ((Vector3<double> *)CONCAT44(iVar2,in_stack_fffffffffffffe80),
             (Vector3<double> *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  Vector<double,_3U>::normalize((Vector<double,_3U> *)CONCAT44(iVar2,in_stack_fffffffffffffe80));
  getPrefix((string *)__last._M_current);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __last._M_current,(char *)CONCAT44(iVar2,in_stack_fffffffffffffe80));
  StaticAnalyser::setOutputName
            ((StaticAnalyser *)CONCAT44(iVar2,in_stack_fffffffffffffe80),
             (string *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  std::__cxx11::string::~string(local_100);
  std::__cxx11::string::~string(local_120);
  return;
}

Assistant:

OrderParameterProbZ::OrderParameterProbZ(
      SimInfo* info, const std::string& filename, const std::string& sele,
      const RealType dipoleX, const RealType dipoleY, const RealType dipoleZ,
      int nbins, int axis) :
      StaticAnalyser(info, filename, nbins),
      selectionScript_(sele), evaluator_(info), seleMan_(info), thermo_(info),
      nbins_(nbins), axis_(axis) {
    evaluator_.loadScriptString(sele);
    if (!evaluator_.isDynamic()) {
      seleMan_.setSelectionSet(evaluator_.evaluate());
    }

    // fixed number of bins
    Count_.resize(nbins);
    std::fill(Count_.begin(), Count_.end(), 0);

    switch (axis_) {
    case 0:
      axisLabel_ = "x";
      refAxis_   = Vector3d(1, 0, 0);
      break;
    case 1:
      axisLabel_ = "y";
      refAxis_   = Vector3d(0, 1, 0);
      break;
    case 2:
    default:
      axisLabel_ = "z";
      refAxis_   = Vector3d(0, 0, 1);
      break;
    }

    dipoleVector_ = Vector3d(dipoleX, dipoleY, dipoleZ);
    dipoleVector_.normalize();

    setOutputName(getPrefix(filename) + ".OrderProb");
  }